

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assume_tests.cpp
# Opt level: O0

void __thiscall iu_AssumeTest_x_iutest_x_C_Test::Body(iu_AssumeTest_x_iutest_x_C_Test *this)

{
  bool bVar1;
  char *pcVar2;
  type **in_stack_fffffffffffffbc8;
  AssertionHelper local_3f0;
  Fixed local_3c0;
  int local_238;
  char local_234 [4];
  undefined1 local_230 [8];
  AssertionResult iutest_ar_1;
  Fixed local_1d8;
  int local_40;
  char local_3c [4];
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  iu_AssumeTest_x_iutest_x_C_Test *this_local;
  
  iutest_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  local_3c[0] = '\0';
  local_3c[1] = '\0';
  local_3c[2] = '\0';
  local_3c[3] = '\0';
  local_40 = 1;
  iutest::internal::backward::EqHelper<true>::Compare<int,int>
            ((AssertionResult *)local_38,(EqHelper<true> *)0x16d7e3,"1",local_3c,&local_40,
             (int *)&iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffbc8);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_1d8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1d8);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_38);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_1.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assume_tests.cpp"
               ,0x2d,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_1.m_result,&local_1d8);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_1.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1d8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  iutest::detail::AlwaysZero();
  local_234[0] = '\0';
  local_234[1] = '\0';
  local_234[2] = '\0';
  local_234[3] = '\0';
  local_238 = 1;
  iutest::internal::backward::EqHelper<true>::Compare<int,int>
            ((AssertionResult *)local_230,(EqHelper<true> *)0x16d7e3,"1",local_234,&local_238,
             (int *)&iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffbc8);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
  if (!bVar1) {
    memset(&local_3c0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_3c0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_230);
    iutest::AssertionHelper::AssertionHelper
              (&local_3f0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assume_tests.cpp"
               ,0x2e,pcVar2,kAssumeFailure);
    iutest::AssertionHelper::operator=(&local_3f0,&local_3c0);
    iutest::AssertionHelper::~AssertionHelper(&local_3f0);
    iutest::AssertionHelper::Fixed::~Fixed(&local_3c0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_230);
  return;
}

Assistant:

IUTEST(AssumeTest, C)
{
    IUTEST_EXPECT_EQ(0, 1);
    IUTEST_ASSUME_EQ(0, 1);
}